

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertUnsignedLongsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  unsigned_long in_RCX;
  char *in_RDX;
  char *in_RSI;
  UtestShell *in_RDI;
  unsigned_long in_R8;
  UnsignedLongsEqualFailure *unaff_retaddr;
  undefined8 in_stack_00000008;
  SimpleString *in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  undefined1 local_98 [112];
  UtestShell *test;
  
  test = in_RDI;
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if (in_RSI != in_RDX) {
    SimpleString::SimpleString(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
              (unaff_retaddr,test,in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_stack_00000010);
    (*in_RDI->_vptr_UtestShell[0x27])(in_RDI,local_98,in_stack_00000008);
    UnsignedLongsEqualFailure::~UnsignedLongsEqualFailure((UnsignedLongsEqualFailure *)0x1229a5);
    SimpleString::~SimpleString((SimpleString *)0x1229af);
  }
  return;
}

Assistant:

void UtestShell::assertUnsignedLongsEqual(unsigned long expected, unsigned long actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(UnsignedLongsEqualFailure (this, fileName, lineNumber, expected, actual, text), testTerminator);
}